

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O1

SXML_CHAR * XMLSearch_get_XPath_string(XMLSearch *search,SXML_CHAR **xpath,SXML_CHAR quote)

{
  bool bVar1;
  undefined8 in_RAX;
  SXML_CHAR *pSVar2;
  char *src2;
  SXML_CHAR *pSVar3;
  SXML_CHAR SVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  _XMLSearch *p_Var8;
  SXML_CHAR squote [2];
  undefined8 uStack_38;
  
  uStack_38._0_6_ = (undefined6)in_RAX;
  uStack_38 = CONCAT26(0x27,(undefined6)uStack_38);
  if (xpath == (SXML_CHAR **)0x0) {
LAB_00106f0d:
    pSVar3 = (SXML_CHAR *)0x0;
  }
  else if (search == (XMLSearch *)0x0) {
    pSVar3 = strdup("");
    *xpath = pSVar3;
  }
  else {
    SVar4 = '\"';
    if (quote != '\0') {
      SVar4 = quote;
    }
    pSVar3 = (SXML_CHAR *)((long)&uStack_38 + 6);
    uStack_38 = (ulong)CONCAT16(SVar4,(undefined6)uStack_38);
    p_Var8 = search;
    do {
      if ((p_Var8 != search) && (pSVar2 = strcat_alloc(xpath,"/"), pSVar2 == (SXML_CHAR *)0x0)) {
LAB_00106efe:
        free(*xpath);
        *xpath = (SXML_CHAR *)0x0;
        goto LAB_00106f0d;
      }
      pcVar6 = p_Var8->tag;
      src2 = "*";
      if ((pcVar6 != (char *)0x0) && (src2 = pcVar6, *pcVar6 == '\0')) {
        src2 = "*";
      }
      pSVar2 = strcat_alloc(xpath,src2);
      if ((pSVar2 == (SXML_CHAR *)0x0) ||
         (((0 < p_Var8->n_attributes || ((p_Var8->text != (char *)0x0 && (*p_Var8->text != '\0'))))
          && (pSVar2 = strcat_alloc(xpath,"["), pSVar2 == (SXML_CHAR *)0x0)))) goto LAB_00106efe;
      bVar1 = true;
      if ((p_Var8->text != (char *)0x0) && (*p_Var8->text != '\0')) {
        pSVar2 = strcat_alloc(xpath,".=");
        if ((pSVar2 == (SXML_CHAR *)0x0) ||
           (((pSVar2 = strcat_alloc(xpath,pSVar3), pSVar2 == (SXML_CHAR *)0x0 ||
             (pSVar2 = strcat_alloc(xpath,p_Var8->text), pSVar2 == (SXML_CHAR *)0x0)) ||
            (pSVar2 = strcat_alloc(xpath,pSVar3), pSVar2 == (SXML_CHAR *)0x0)))) goto LAB_00106efe;
        bVar1 = false;
      }
      if (p_Var8->n_attributes < 1) {
        bVar1 = false;
      }
      else {
        lVar5 = 0;
        lVar7 = 0;
        do {
          if (((!bVar1) && (pSVar2 = strcat_alloc(xpath,", "), pSVar2 == (SXML_CHAR *)0x0)) ||
             ((pSVar2 = strcat_alloc(xpath,"@"), pSVar2 == (SXML_CHAR *)0x0 ||
              (pSVar2 = strcat_alloc(xpath,*(SXML_CHAR **)((long)&p_Var8->attributes->name + lVar5))
              , pSVar2 == (SXML_CHAR *)0x0)))) goto LAB_00106efe;
          if (*(long *)((long)&p_Var8->attributes->value + lVar5) != 0) {
            pcVar6 = "=";
            if (*(int *)((long)&p_Var8->attributes->active + lVar5) == 0) {
              pcVar6 = "!=";
            }
            pSVar2 = strcat_alloc(xpath,pcVar6);
            if (((pSVar2 == (SXML_CHAR *)0x0) ||
                (pSVar2 = strcat_alloc(xpath,pSVar3), pSVar2 == (SXML_CHAR *)0x0)) ||
               ((pSVar2 = strcat_alloc(xpath,*(SXML_CHAR **)
                                              ((long)&p_Var8->attributes->value + lVar5)),
                pSVar2 == (SXML_CHAR *)0x0 ||
                (pSVar2 = strcat_alloc(xpath,pSVar3), pSVar2 == (SXML_CHAR *)0x0))))
            goto LAB_00106efe;
          }
          lVar7 = lVar7 + 1;
          lVar5 = lVar5 + 0x18;
          bVar1 = false;
        } while (lVar7 < p_Var8->n_attributes);
        bVar1 = 0 < p_Var8->n_attributes;
      }
      if (p_Var8->text == (char *)0x0) {
        if (bVar1) goto LAB_00106ed8;
      }
      else if (bVar1 || *p_Var8->text != '\0') {
LAB_00106ed8:
        pSVar2 = strcat_alloc(xpath,"]");
        if (pSVar2 == (SXML_CHAR *)0x0) goto LAB_00106efe;
      }
      p_Var8 = p_Var8->next;
    } while (p_Var8 != (_XMLSearch *)0x0);
    pSVar3 = *xpath;
  }
  return pSVar3;
}

Assistant:

SXML_CHAR* XMLSearch_get_XPath_string(const XMLSearch* search, SXML_CHAR** xpath, SXML_CHAR quote)
{
	const XMLSearch* s;
	SXML_CHAR squote[] = C2SX("'");
	int i, fill;

	if (xpath == NULL)
		return NULL;

	/* NULL 'search' is an empty string */
	if (search == NULL) {
		*xpath = sx_strdup(C2SX(""));
		if (*xpath == NULL)
			return NULL;

		return *xpath;
	}

	squote[0] = (quote == NULC ? XML_DEFAULT_QUOTE : quote);

	for (s = search; s != NULL; s = s->next) {
		if (s != search && strcat_alloc(xpath, C2SX("/")) == NULL) goto err; /* No "/" prefix for the first criteria */
		if (strcat_alloc(xpath, s->tag == NULL || s->tag[0] == NULC ? C2SX("*"): s->tag) == NULL) goto err;

		if (s->n_attributes > 0 || (s->text != NULL && s->text[0] != NULC))
			if (strcat_alloc(xpath, C2SX("[")) == NULL) goto err;

		fill = FALSE; /* '[' has not been filled with text yet, no ", " separator should be added */
		if (s->text != NULL && s->text[0] != NULC) {
			if (strcat_alloc(xpath, C2SX(".=")) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			if (strcat_alloc(xpath, s->text) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			fill = TRUE;
		}

		for (i = 0; i < s->n_attributes; i++) {
			if (fill) {
				if (strcat_alloc(xpath, C2SX(", ")) == NULL) goto err;
			} else
				fill = TRUE; /* filling is being performed */
			if (strcat_alloc(xpath, C2SX("@")) == NULL) goto err;
			if (strcat_alloc(xpath, s->attributes[i].name) == NULL) goto err;
			if (s->attributes[i].value == NULL) continue;

			if (strcat_alloc(xpath, s->attributes[i].active ? C2SX("=") : C2SX("!=")) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			if (strcat_alloc(xpath, s->attributes[i].value) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
		}
		if ((s->text != NULL && s->text[0] != NULC) || s->n_attributes > 0) {
			if (strcat_alloc(xpath, C2SX("]")) == NULL) goto err;
		}
	}

	return *xpath;

err:
	__free(*xpath);
	*xpath = NULL;

	return NULL;
}